

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fAtomicCounterTests.cpp
# Opt level: O2

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::operationToDescription_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,Operation *operations,
          bool useBranch)

{
  uint uVar1;
  char *pcVar2;
  ostringstream stream;
  ostringstream aoStack_198 [376];
  
  std::__cxx11::ostringstream::ostringstream(aoStack_198);
  std::operator<<((ostream *)aoStack_198,"Test ");
  uVar1 = *(uint *)this;
  if ((uVar1 & 4) != 0) {
    std::operator<<((ostream *)aoStack_198,"atomicCounter()");
    uVar1 = *(uint *)this;
  }
  if ((uVar1 & 1) != 0) {
    std::operator<<((ostream *)aoStack_198,", ");
    std::operator<<((ostream *)aoStack_198," atomicCounterIncrement()");
    uVar1 = *(uint *)this;
  }
  if ((uVar1 & 2) != 0) {
    std::operator<<((ostream *)aoStack_198,", ");
    std::operator<<((ostream *)aoStack_198," atomicCounterDecrement()");
  }
  pcVar2 = ".";
  if ((char)operations != '\0') {
    pcVar2 = " calls with branches.";
  }
  std::operator<<((ostream *)aoStack_198,pcVar2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(aoStack_198);
  return __return_storage_ptr__;
}

Assistant:

string operationToDescription (const AtomicCounterTest::Operation& operations, bool useBranch)
{
	std::ostringstream	stream;
	bool				firstOperation = 0;

	stream
	<< "Test ";

	if ((operations & AtomicCounterTest::OPERATION_GET) != 0)
	{
		stream << "atomicCounter()";
		firstOperation = false;
	}

	if ((operations & AtomicCounterTest::OPERATION_INC) != 0)
	{
		if (!firstOperation)
			stream << ", ";

		stream << " atomicCounterIncrement()";
		firstOperation = false;
	}

	if ((operations & AtomicCounterTest::OPERATION_DEC) != 0)
	{
		if (!firstOperation)
			stream << ", ";

		stream << " atomicCounterDecrement()";
		firstOperation = false;
	}


	if (useBranch)
		stream << " calls with branches.";
	else
		stream << ".";

	return stream.str();
}